

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_mulmod(mp_int *a,mp_int *b,mp_int *c,mp_int *d)

{
  mp_digit *__ptr;
  int iVar1;
  mp_int local_48;
  
  local_48.dp = (mp_digit *)malloc(0x100);
  if (local_48.dp == (mp_digit *)0x0) {
    iVar1 = -2;
  }
  else {
    memset(local_48.dp,0,0x100);
    local_48.used = 0;
    local_48.alloc = 0x20;
    local_48.sign = 0;
    iVar1 = mp_mul(a,b,&local_48);
    if (iVar1 == 0) {
      iVar1 = mp_mod(&local_48,c,d);
    }
    __ptr = local_48.dp;
    if (local_48.dp != (mp_digit *)0x0) {
      if (0 < (long)local_48.used) {
        memset(local_48.dp,0,(long)local_48.used << 3);
      }
      free(__ptr);
    }
  }
  return iVar1;
}

Assistant:

int mp_mulmod (mp_int * a, mp_int * b, mp_int * c, mp_int * d)
{
  int     res;
  mp_int  t;

  if ((res = mp_init (&t)) != MP_OKAY) {
    return res;
  }

  if ((res = mp_mul (a, b, &t)) != MP_OKAY) {
    mp_clear (&t);
    return res;
  }

  res = mp_mod (&t, c, d);
  mp_clear (&t);

  return res;
}